

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::f_less(Forth *this)

{
  ForthStack<double> *this_00;
  double dVar1;
  double dVar2;
  
  requireDStackAvailable(this,1,"F<");
  requireFStackDepth(this,2,"F<");
  this_00 = &this->fStack;
  dVar1 = ForthStack<double>::getTop(this_00);
  ForthStack<double>::pop(this_00);
  dVar2 = ForthStack<double>::getTop(this_00);
  ForthStack<double>::pop(this_00);
  ForthStack<unsigned_int>::push(&this->dStack,(&this->False)[dVar2 < dVar1]);
  return;
}

Assistant:

void f_less() {
			REQUIRE_DSTACK_AVAILABLE(1, "F<");
			REQUIRE_FSTACK_DEPTH(2, "F<");
			auto r2 = fStack.getTop(); fStack.pop();
			auto r1 = fStack.getTop(); fStack.pop();
			dStack.push(r1 < r2 ? True : False);
		}